

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.h
# Opt level: O3

void __thiscall HighsCliqueTable::HighsCliqueTable(HighsCliqueTable *this,HighsInt ncols)

{
  _Rb_tree_header *p_Var1;
  size_type __new_size;
  size_type __new_size_00;
  value_type_conflict5 local_59;
  vector<int,_std::allocator<int>_> *local_58;
  vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_> *local_50;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *local_48
  ;
  vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_> *local_40;
  value_type_conflict2 local_34;
  
  local_50 = &this->invertedHashListSizeTwo;
  local_48 = &this->sizeTwoCliques;
  (this->invertedHashListSizeTwo).
  super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->invertedHashListSizeTwo).
  super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->invertedHashList).
  super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->invertedHashList).
  super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cliqueentries).
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->invertedHashList).
  super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cliqueentries).
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cliqueentries).
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->invertedHashListSizeTwo).
  super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = &this->invertedHashList;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
  HighsHashTable(local_48);
  p_Var1 = &(this->freespaces)._M_t._M_impl.super__Rb_tree_header;
  (this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_58 = &this->numcliquesvar;
  memset(&(this->freespaces)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x128);
  (this->randgen).state = 0x9eefcacfa6167af6;
  __new_size_00 = (size_type)ncols;
  __new_size = __new_size_00 * 2;
  std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::resize
            (&this->invertedHashList,__new_size);
  std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::resize
            (local_50,__new_size);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::resize(local_58,__new_size,&local_34);
  std::vector<int,_std::allocator<int>_>::resize(&this->colsubstituted,__new_size_00);
  local_59 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->colDeleted,__new_size_00,&local_59);
  this->nfixings = 0;
  this->numEntries = 0;
  this->maxEntries = 0x7fffffff;
  this->minEntriesForParallelism = 0x7fffffff;
  this->numNeighbourhoodQueries = 0;
  this->inPresolve = false;
  return;
}

Assistant:

HighsCliqueTable(HighsInt ncols) {
    invertedHashList.resize(2 * static_cast<size_t>(ncols));
    invertedHashListSizeTwo.resize(2 * static_cast<size_t>(ncols));
    numcliquesvar.resize(2 * static_cast<size_t>(ncols), 0);
    colsubstituted.resize(ncols);
    colDeleted.resize(ncols, false);
    nfixings = 0;
    numNeighbourhoodQueries = 0;
    numEntries = 0;
    maxEntries = kHighsIInf;
    minEntriesForParallelism = kHighsIInf;
    inPresolve = false;
  }